

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_opt_start(lua_State *L)

{
  GCstr *__s1;
  undefined4 *puVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  GCstr *pGVar5;
  ulong uVar6;
  size_t __n;
  long lVar7;
  int narg;
  char *pcVar8;
  GCstr *__s1_00;
  ulong __n_00;
  uint uVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  
  uVar6 = (ulong)(L->glref).ptr32;
  iVar3 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
  if (iVar3 == 0) {
    *(uint *)(uVar6 + 0x220) = *(uint *)(uVar6 + 0x220) & 0xf000ffff | 0x3ff0000;
  }
  else if (0 < iVar3) {
    narg = 1;
    do {
      pGVar5 = lj_lib_checkstr(L,narg);
      cVar2 = (char)pGVar5[1].nextgc.gcptr32;
      if (((byte)(cVar2 - 0x30U) < 10) && (*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 1) == '\0'))
      {
        uVar9 = 0x3ff0000;
        if ((byte)(cVar2 - 0x30U) < 3) {
          uVar9 = *(uint *)(&DAT_00155ecc + (ulong)(byte)(cVar2 - 0x30U) * 4);
        }
        uVar9 = *(uint *)(uVar6 + 0x220) & 0xf000ffff | uVar9;
LAB_00149caa:
        *(uint *)(uVar6 + 0x220) = uVar9;
      }
      else {
        __s1 = pGVar5 + 1;
        if (cVar2 == 'n') {
          if (*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 1) == 'o') {
            __s1_00 = (GCstr *)((long)&(__s1->nextgc).gcptr32 +
                               (ulong)(*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 2) == '-') + 2);
            goto LAB_00149b45;
          }
LAB_00149b4d:
          bVar10 = false;
          __s1_00 = __s1;
        }
        else if (cVar2 == '-') {
          __s1_00 = (GCstr *)((long)&pGVar5[1].nextgc.gcptr32 + 1);
LAB_00149b45:
          bVar10 = true;
        }
        else {
          if (cVar2 != '+') goto LAB_00149b4d;
          bVar10 = false;
          __s1_00 = (GCstr *)((long)&pGVar5[1].nextgc.gcptr32 + 1);
        }
        uVar9 = 0x10000;
        __n = 4;
        pcVar8 = "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse";
        do {
          iVar4 = strncmp((char *)__s1_00,(char *)((byte *)pcVar8 + 1),__n);
          if ((iVar4 == 0) && (*(char *)((long)&(__s1_00->nextgc).gcptr32 + __n) == '\0')) {
            if (bVar10) {
              uVar9 = ~uVar9 & *(uint *)(uVar6 + 0x220);
            }
            else {
              uVar9 = uVar9 | *(uint *)(uVar6 + 0x220);
            }
            goto LAB_00149caa;
          }
          pcVar8 = (char *)((byte *)pcVar8 + __n + 1);
          uVar9 = uVar9 * 2;
          __n = (size_t)(byte)*pcVar8;
        } while (__n != 0);
        lVar7 = 0;
        pcVar8 = 
        "\bmaxtrace\tmaxrecord\nmaxirconst\amaxside\amaxsnap\ahotloop\ahotexit\atryside\ninstunroll\nloopunroll\ncallunroll\trecunroll\tsizemcode\bmaxmcode"
        ;
        while( true ) {
          __n_00 = (ulong)(byte)*pcVar8;
          iVar4 = strncmp((char *)__s1,(char *)((byte *)pcVar8 + 1),__n_00);
          if ((iVar4 == 0) && (*(char *)((long)&(__s1->nextgc).gcptr32 + __n_00) == '=')) break;
          pcVar8 = (char *)((byte *)pcVar8 + __n_00 + 1);
          lVar7 = lVar7 + 1;
          if ((int)lVar7 == 0xe) goto LAB_00149ced;
        }
        cVar2 = *(char *)((long)&pGVar5[1].nextgc.gcptr32 + __n_00 + 1);
        iVar4 = 0;
        if ((byte)(cVar2 - 0x30U) < 10) {
          pcVar8 = (char *)((long)&pGVar5[1].nextgc.gcptr32 + __n_00 + 2);
          iVar4 = 0;
          do {
            iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
            cVar2 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while ((byte)(cVar2 - 0x30U) < 10);
        }
        if (cVar2 != '\0') {
LAB_00149ced:
          lj_err_callerv(L,LJ_ERR_JITOPT,__s1);
        }
        *(int *)(uVar6 + 0x790 + lVar7 * 4) = iVar4;
        if ((int)lVar7 == 5) {
          auVar12 = ZEXT416(*(int *)(uVar6 + 0x7a4) * 2 - 1);
          auVar12 = pshuflw(auVar12,auVar12,0);
          uVar11 = auVar12._0_4_;
          lVar7 = 0;
          do {
            puVar1 = (undefined4 *)(uVar6 + 0xb38 + lVar7 * 2);
            *puVar1 = uVar11;
            puVar1[1] = uVar11;
            puVar1[2] = uVar11;
            puVar1[3] = uVar11;
            lVar7 = lVar7 + 8;
          } while (lVar7 != 0x40);
        }
      }
      bVar10 = narg != iVar3;
      narg = narg + 1;
    } while (bVar10);
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_opt_start)
{
  jit_State *J = L2J(L);
  int nargs = (int)(L->top - L->base);
  if (nargs == 0) {
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | JIT_F_OPT_DEFAULT;
  } else {
    int i;
    for (i = 1; i <= nargs; i++) {
      const char *str = strdata(lj_lib_checkstr(L, i));
      if (!jitopt_level(J, str) &&
	  !jitopt_flag(J, str) &&
	  !jitopt_param(J, str))
	lj_err_callerv(L, LJ_ERR_JITOPT, str);
    }
  }
  return 0;
}